

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O1

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenStructArgs
          (CSharpGenerator *this,StructDef *struct_def,string *code_ptr,char *nameprefix,
          size_t array_count)

{
  size_t array_count_00;
  BaseType BVar1;
  FieldDef *field;
  StructDef *pSVar2;
  EnumDef *pEVar3;
  char *pcVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  pointer ppFVar10;
  ulong uVar11;
  long lVar12;
  string local_e0;
  CSharpGenerator *local_c0;
  char *local_b8;
  size_t local_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  Type local_88;
  long local_68;
  StructDef *local_60;
  StructDef *local_58;
  string local_50;
  
  ppFVar10 = (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar10 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68 = array_count - 1;
    local_c0 = this;
    local_b8 = nameprefix;
    local_b0 = array_count;
    local_58 = struct_def;
    do {
      field = *ppFVar10;
      BVar1 = (field->value).type.base_type;
      if (BVar1 == BASE_TYPE_ARRAY) {
        pSVar2 = (field->value).type.struct_def;
        pEVar3 = (field->value).type.enum_def;
        local_88.fixed_length = (field->value).type.fixed_length;
        local_88.element = BASE_TYPE_NONE;
        local_88.base_type = (field->value).type.element;
        local_88.struct_def._0_2_ = SUB82(pSVar2,0);
        local_88.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
        local_88.enum_def._0_2_ = SUB82(pEVar3,0);
        local_88.enum_def._2_6_ = (undefined6)((ulong)pEVar3 >> 0x10);
      }
      else {
        local_88.base_type = (field->value).type.base_type;
        local_88.element = (field->value).type.element;
        pSVar2 = (field->value).type.struct_def;
        uVar8 = *(undefined8 *)((long)&(field->value).type.enum_def + 2);
        local_88.enum_def._0_2_ =
             (undefined2)((ulong)*(undefined8 *)((long)&(field->value).type.struct_def + 2) >> 0x30)
        ;
        local_88.enum_def._2_6_ = (undefined6)uVar8;
        local_88.fixed_length = (uint16_t)((ulong)uVar8 >> 0x30);
        local_88.struct_def._0_2_ = SUB82(pSVar2,0);
        local_88.struct_def._2_6_ = (undefined6)((ulong)pSVar2 >> 0x10);
      }
      uVar11 = (ulong)(BVar1 == BASE_TYPE_ARRAY);
      array_count_00 = uVar11 + local_b0;
      if ((local_88.base_type == BASE_TYPE_STRUCT) &&
         (*(char *)(CONCAT62(local_88.struct_def._2_6_,local_88.struct_def._0_2_) + 0x110) == '\x01'
         )) {
        local_60 = (field->value).type.struct_def;
        EscapeKeyword(&local_50,local_c0,(string *)field);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        pcVar4 = local_b8;
        plVar6 = plVar5 + 2;
        if ((long *)*plVar5 == plVar6) {
          local_98 = *plVar6;
          lStack_90 = plVar5[3];
          local_a8 = &local_98;
        }
        else {
          local_98 = *plVar6;
          local_a8 = (long *)*plVar5;
        }
        local_a0 = plVar5[1];
        *plVar5 = (long)plVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        strlen(local_b8);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,(ulong)pcVar4)
        ;
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_e0.field_2._M_allocated_capacity = *psVar7;
          local_e0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_e0.field_2._M_allocated_capacity = *psVar7;
          local_e0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_e0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        GenStructArgs(local_c0,local_60,code_ptr,local_e0._M_dataplus._M_p,array_count_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        uVar8 = local_50.field_2._M_allocated_capacity;
        _Var9._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_001b74e7:
          operator_delete(_Var9._M_p,uVar8 + 1);
        }
      }
      else {
        std::__cxx11::string::append((char *)code_ptr);
        GenTypeBasic_abi_cxx11_(&local_e0,local_c0,&local_88,true);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (((field->value).type.base_type - BASE_TYPE_UTYPE < 0xc) &&
           (field->presence == kOptional)) {
          std::__cxx11::string::append((char *)code_ptr);
        }
        if (array_count_00 != 0) {
          std::__cxx11::string::append((char *)code_ptr);
          if (array_count_00 != 1) {
            lVar12 = uVar11 + local_68;
            do {
              std::__cxx11::string::append((char *)code_ptr);
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          std::__cxx11::string::append((char *)code_ptr);
        }
        std::__cxx11::string::append((char *)code_ptr);
        std::__cxx11::string::append((char *)code_ptr);
        Name_abi_cxx11_(&local_e0,local_c0,field);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_e0._M_dataplus._M_p);
        uVar8 = local_e0.field_2._M_allocated_capacity;
        _Var9._M_p = local_e0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_001b74e7;
      }
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 !=
             (local_58->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenStructArgs(const StructDef &struct_def, std::string *code_ptr,
                     const char *nameprefix, size_t array_count = 0) const {
    std::string &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      const auto &field_type = field.value.type;
      const auto array_field = IsArray(field_type);
      const auto &type = array_field ? field_type.VectorType() : field_type;
      const auto array_cnt = array_field ? (array_count + 1) : array_count;
      if (IsStruct(type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        GenStructArgs(*field_type.struct_def, code_ptr,
                      (nameprefix + (EscapeKeyword(field.name) + "_")).c_str(),
                      array_cnt);
      } else {
        code += ", ";
        code += GenTypeBasic(type);
        if (field.IsScalarOptional()) { code += "?"; }
        if (array_cnt > 0) {
          code += "[";
          for (size_t i = 1; i < array_cnt; i++) code += ",";
          code += "]";
        }
        code += " ";
        code += nameprefix;
        code += Name(field);
      }
    }
  }